

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O2

void __thiscall pmx::PmxMorphMaterialOffset::PmxMorphMaterialOffset(PmxMorphMaterialOffset *this)

{
  long lVar1;
  
  (this->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0082ce10;
  this->specularity = 0.0;
  this->edge_size = 0.0;
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->ambient + lVar1 + -4) = 0;
    *(undefined4 *)((long)this->edge_color + lVar1) = 0;
  }
  for (lVar1 = -0x10; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->specular + lVar1) = 0;
    *(undefined4 *)((long)this->texture_argb + lVar1 + -4) = 0;
    *(undefined4 *)((long)this->sphere_texture_argb + lVar1) = 0;
    *(undefined4 *)((long)this->toon_texture_argb + lVar1) = 0;
    *(undefined4 *)((long)this[1].diffuse + lVar1 + -0x10) = 0;
  }
  return;
}

Assistant:

PmxMorphMaterialOffset()
			: specularity(0.0f)
			, edge_size(0.0f)
		{
			for (int i = 0; i < 3; ++i) {
				specular[i] = 0.0f;
				ambient[i] = 0.0f;
			}
			for (int i = 0; i < 4; ++i) {
				diffuse[i] = 0.0f;
				edge_color[i] = 0.0f;
				texture_argb[i] = 0.0f;
				sphere_texture_argb[i] = 0.0f;
				toon_texture_argb[i] = 0.0f;
			}
		}